

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc_manager_direct.cc
# Opt level: O0

void __thiscall webrtc::AgcManagerDirect::UpdateGain(AgcManagerDirect *this)

{
  bool bVar1;
  uint uVar2;
  int new_level;
  pointer pAVar3;
  int *piVar4;
  ostream *poVar5;
  LogMessage local_1a8;
  LogMessageVoidify local_21;
  int local_20;
  int local_1c;
  int local_18;
  int residual_gain;
  int raw_compression;
  int rms_error;
  AgcManagerDirect *this_local;
  
  residual_gain = 0;
  _raw_compression = this;
  pAVar3 = std::unique_ptr<webrtc::Agc,_std::default_delete<webrtc::Agc>_>::operator->(&this->agc_);
  uVar2 = (*pAVar3->_vptr_Agc[4])(pAVar3,&residual_gain);
  if ((uVar2 & 1) != 0) {
    residual_gain = residual_gain + 2;
    piVar4 = std::min<int>(&residual_gain,&this->max_compression_gain_);
    piVar4 = std::max<int>(piVar4,&(anonymous_namespace)::kMinCompressionGain);
    local_18 = *piVar4;
    if (((local_18 == this->max_compression_gain_) &&
        (this->target_compression_ == this->max_compression_gain_ + -1)) ||
       ((local_18 == 2 && (this->target_compression_ == 3)))) {
      this->target_compression_ = local_18;
    }
    else {
      this->target_compression_ =
           (local_18 - this->target_compression_) / 2 + this->target_compression_;
    }
    local_1c = residual_gain - local_18;
    local_20 = -0xf;
    piVar4 = std::max<int>(&local_1c,&local_20);
    piVar4 = std::min<int>(piVar4,&(anonymous_namespace)::kMaxResidualGainChange);
    local_1c = *piVar4;
    bVar1 = LogMessage::Loggable(LS_INFO);
    if (bVar1) {
      LogMessageVoidify::LogMessageVoidify(&local_21);
      LogMessage::LogMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/agc_manager_direct.cc"
                 ,400,LS_INFO);
      poVar5 = LogMessage::stream(&local_1a8);
      poVar5 = std::operator<<(poVar5,"[agc] rms_error=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,residual_gain);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,"target_compression=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->target_compression_);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::operator<<(poVar5,"residual_gain=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c);
      LogMessageVoidify::operator&(&local_21,poVar5);
      LogMessage::~LogMessage(&local_1a8);
    }
    if (local_1c != 0) {
      new_level = anon_unknown_0::LevelFromGainError(local_1c,this->level_);
      SetLevel(this,new_level);
    }
  }
  return;
}

Assistant:

void AgcManagerDirect::UpdateGain() {
  int rms_error = 0;
  if (!agc_->GetRmsErrorDb(&rms_error)) {
    // No error update ready.
    return;
  }
  // The compressor will always add at least kMinCompressionGain. In effect,
  // this adjusts our target gain upward by the same amount and rms_error
  // needs to reflect that.
  rms_error += kMinCompressionGain;

  // Handle as much error as possible with the compressor first.
  int raw_compression = std::max(std::min(rms_error, max_compression_gain_),
                                 kMinCompressionGain);
  // Deemphasize the compression gain error. Move halfway between the current
  // target and the newly received target. This serves to soften perceptible
  // intra-talkspurt adjustments, at the cost of some adaptation speed.
  if ((raw_compression == max_compression_gain_ &&
      target_compression_ == max_compression_gain_ - 1) ||
      (raw_compression == kMinCompressionGain &&
      target_compression_ == kMinCompressionGain + 1)) {
    // Special case to allow the target to reach the endpoints of the
    // compression range. The deemphasis would otherwise halt it at 1 dB shy.
    target_compression_ = raw_compression;
  } else {
    target_compression_ = (raw_compression - target_compression_) / 2
        + target_compression_;
  }

  // Residual error will be handled by adjusting the volume slider. Use the
  // raw rather than deemphasized compression here as we would otherwise
  // shrink the amount of slack the compressor provides.
  int residual_gain = rms_error - raw_compression;
  residual_gain = std::min(std::max(residual_gain, -kMaxResidualGainChange),
      kMaxResidualGainChange);
  LOG(LS_INFO) << "[agc] rms_error=" << rms_error << ", "
               << "target_compression=" << target_compression_ << ", "
               << "residual_gain=" << residual_gain;
  if (residual_gain == 0)
    return;

  SetLevel(LevelFromGainError(residual_gain, level_));
}